

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

double __thiscall Imath_3_2::Matrix44<double>::determinant(Matrix44<double> *this)

{
  double dVar1;
  Matrix44<double> *in_RDI;
  double dVar2;
  double sum;
  double local_10;
  
  local_10 = 0.0;
  dVar1 = in_RDI->x[0][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = in_RDI->x[0][3];
    dVar2 = fastMinor(in_RDI,1,2,3,0,1,2);
    local_10 = -dVar1 * dVar2 + 0.0;
  }
  dVar1 = in_RDI->x[1][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = in_RDI->x[1][3];
    dVar2 = fastMinor(in_RDI,0,2,3,0,1,2);
    local_10 = dVar1 * dVar2 + local_10;
  }
  dVar1 = in_RDI->x[2][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = in_RDI->x[2][3];
    dVar2 = fastMinor(in_RDI,0,1,3,0,1,2);
    local_10 = -dVar1 * dVar2 + local_10;
  }
  dVar1 = in_RDI->x[3][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = in_RDI->x[3][3];
    dVar2 = fastMinor(in_RDI,0,1,2,0,1,2);
    local_10 = dVar1 * dVar2 + local_10;
  }
  return local_10;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Matrix44<T>::determinant () const IMATH_NOEXCEPT
{
    T sum = (T) 0;

    if (x[0][3] != 0.) sum -= x[0][3] * fastMinor (1, 2, 3, 0, 1, 2);
    if (x[1][3] != 0.) sum += x[1][3] * fastMinor (0, 2, 3, 0, 1, 2);
    if (x[2][3] != 0.) sum -= x[2][3] * fastMinor (0, 1, 3, 0, 1, 2);
    if (x[3][3] != 0.) sum += x[3][3] * fastMinor (0, 1, 2, 0, 1, 2);

    return sum;
}